

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_appender.cpp
# Opt level: O3

ArrowArray * __thiscall
duckdb::ArrowAppender::Finalize(ArrowArray *__return_storage_ptr__,ArrowAppender *this)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> _Var2;
  ArrowAppendData *this_00;
  type data;
  pointer pAVar3;
  long lVar4;
  reference type;
  reference pvVar5;
  ArrowArray *pAVar6;
  reference pvVar7;
  ulong __n;
  byte bVar8;
  templated_unique_single_t root_holder;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_58;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_50;
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  local_48;
  
  bVar8 = 0;
  this_00 = (ArrowAppendData *)operator_new(0x148);
  ArrowAppendData::ArrowAppendData(this_00,&this->options);
  local_58._M_head_impl = this_00;
  data = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
         operator*((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                    *)&local_58);
  AddChildren(data,((long)(this->types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)&local_58);
  __return_storage_ptr__->children =
       (pAVar3->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                    (((long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  __return_storage_ptr__->n_children = lVar4;
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(this->row_count);
  __return_storage_ptr__->length = lVar4;
  __return_storage_ptr__->n_buffers = 1;
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)&local_58);
  __return_storage_ptr__->buffers = (pAVar3->buffers)._M_elems;
  __return_storage_ptr__->dictionary = (ArrowArray *)0x0;
  __return_storage_ptr__->null_count = 0;
  __return_storage_ptr__->offset = 0;
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)&local_58);
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pAVar3->child_data).
       super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar1 = (this->root_data).
           super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pAVar3->child_data).
       super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pAVar3->child_data).
       super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pAVar3->child_data).
  super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->root_data).
       super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pAVar3->child_data).
  super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (pAVar3->child_data).
  super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->root_data).
       super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->root_data).
  super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root_data).
  super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root_data).
  super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ::~vector(&local_48);
  __n = 0;
  while( true ) {
    pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                           *)&local_58);
    _Var2._M_head_impl = local_58._M_head_impl;
    if ((ulong)((long)(pAVar3->child_data).
                      super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pAVar3->child_data).
                      super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
    type = vector<duckdb::LogicalType,_true>::operator[](&this->types,__n);
    pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                           *)&local_58);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
             ::operator[](&pAVar3->child_data,__n);
    local_50._M_head_impl =
         (pvVar5->
         super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
         .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
    (pvVar5->
    super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)._M_t.
    super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
    .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
    pAVar6 = FinalizeChild(type,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                                 *)&local_50);
    pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                           *)&local_58);
    pvVar7 = vector<ArrowArray,_true>::operator[](&pAVar3->child_arrays,__n);
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pvVar7->length = pAVar6->length;
      pAVar6 = (ArrowArray *)((long)pAVar6 + (ulong)bVar8 * -0x10 + 8);
      pvVar7 = (reference)((long)pvVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
    ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
                 *)&local_50);
    __n = __n + 1;
  }
  local_58._M_head_impl = (ArrowAppendData *)0x0;
  __return_storage_ptr__->private_data = _Var2._M_head_impl;
  __return_storage_ptr__->release = ReleaseArray;
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_58);
  return __return_storage_ptr__;
}

Assistant:

ArrowArray ArrowAppender::Finalize() {
	D_ASSERT(root_data.size() == types.size());
	auto root_holder = make_uniq<ArrowAppendData>(options);

	ArrowArray result;
	AddChildren(*root_holder, types.size());
	result.children = root_holder->child_pointers.data();
	result.n_children = NumericCast<int64_t>(types.size());

	// Configure root array
	result.length = NumericCast<int64_t>(row_count);
	result.n_buffers = 1;
	result.buffers = root_holder->buffers.data(); // there is no actual buffer there since we don't have NULLs
	result.offset = 0;
	result.null_count = 0; // needs to be 0
	result.dictionary = nullptr;
	root_holder->child_data = std::move(root_data);

	for (idx_t i = 0; i < root_holder->child_data.size(); i++) {
		root_holder->child_arrays[i] = *ArrowAppender::FinalizeChild(types[i], std::move(root_holder->child_data[i]));
	}

	// Release ownership to caller
	result.private_data = root_holder.release();
	result.release = ArrowAppender::ReleaseArray;
	return result;
}